

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall nivalis::ParseSession::parse(ParseSession *this)

{
  bool bVar1;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RSI;
  Expr *in_RDI;
  vector<long,_std::allocator<long>_> *unaff_retaddr;
  ParseSession *in_stack_00000478;
  int in_stack_000029a4;
  int64_t in_stack_000029a8;
  int64_t in_stack_000029b0;
  ParseSession *in_stack_000029b8;
  Expr *this_00;
  size_type __new_size;
  Expr *__new_size_00;
  
  this_00 = in_RDI;
  __new_size_00 = in_RDI;
  std::__cxx11::string::size();
  __new_size = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::resize
            (unaff_retaddr,(size_type)__new_size_00,(value_type_conflict3 *)in_RSI);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::clear
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x120872);
  bVar1 = _mk_tok_link(in_stack_00000478);
  if (bVar1) {
    std::__cxx11::string::size();
    bVar1 = _parse(in_stack_000029b8,in_stack_000029b0,in_stack_000029a8,in_stack_000029a4);
    if (bVar1) goto LAB_001208c8;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::clear
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x1208b5);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (in_RSI,__new_size);
LAB_001208c8:
  Expr::Expr(this_00,in_RDI);
  return this_00;
}

Assistant:

Expr parse() {
        tok_link.resize(expr.size(), -1);
        result.ast.clear();
        if (!_mk_tok_link() ||
            !_parse(0, static_cast<int64_t>(expr.size()), _PRI_LOWEST)) {
            result.ast.clear();
            result.ast.resize(1);
        }
        return result;
    }